

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverNonserialDynamicProgramming.cpp
# Opt level: O0

LIndex __thiscall
BGCG_SolverNonserialDynamicProgramming::GetJpolIndexForBestResponses
          (BGCG_SolverNonserialDynamicProgramming *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *agentOrdering)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  type pBVar4;
  undefined4 extraout_var;
  LIndex i;
  reference puVar5;
  size_type sVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  const_reference this_01;
  const_reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  long in_RDI;
  LIndex bestJointBGPolicyIndex;
  Index brSc_jointIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrNeighborsPolicies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedBRIs;
  Scope *brSc;
  Index agI_1;
  const_reverse_iterator rit;
  Index neighJointPol;
  vector<unsigned_int,_std::allocator<unsigned_int>_> selectedBRIs;
  Index agI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrPols;
  size_t nrAgents;
  BGCG_Solver *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  value_type in_stack_fffffffffffffe74;
  Index in_stack_fffffffffffffe78;
  Index in_stack_fffffffffffffe7c;
  allocator_type *in_stack_fffffffffffffe80;
  Scope *in_stack_fffffffffffffe88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe90;
  Scope local_e9 [2];
  const_reference local_b0;
  uint local_a4;
  uint local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  shared_ptr<const_BayesianGameCollaborativeGraphical> local_70;
  ulong local_60;
  uint local_54;
  shared_ptr<const_BayesianGameCollaborativeGraphical> local_28;
  ulong local_18;
  
  BGCG_Solver::GetBGCG(in_stack_fffffffffffffe68);
  pBVar4 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(&local_28);
  iVar2 = (*(pBVar4->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::~shared_ptr
            ((shared_ptr<const_BayesianGameCollaborativeGraphical> *)0x88a008);
  local_18 = CONCAT44(extraout_var,iVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x88a022);
  for (local_54 = 0; local_54 < local_18; local_54 = local_54 + 1) {
    BGCG_Solver::GetBGCG(in_stack_fffffffffffffe68);
    boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(&local_70);
    i = BayesianGameBase::GetNrPolicies
                  ((BayesianGameBase *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                   ,(Index)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    IVar3 = Globals::CastLIndexToIndex(i);
    local_60 = (ulong)IVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (value_type_conflict2 *)in_stack_fffffffffffffe68);
    boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::~shared_ptr
              ((shared_ptr<const_BayesianGameCollaborativeGraphical> *)0x88a0c7);
  }
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x88a161);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88,
             (allocator_type *)in_stack_fffffffffffffe80);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x88a187);
  local_90 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    puVar5 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    local_a4 = *puVar5;
    local_b0 = std::vector<Scope,_std::allocator<Scope>_>::operator[]
                         ((vector<Scope,_std::allocator<Scope>_> *)(in_RDI + 400),(ulong)local_a4);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b0->super_SDT);
    if (sVar6 == 0) {
      local_90 = 0;
    }
    else {
      this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b0->super_SDT)
      ;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x88a268);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (this_00,(size_type)in_stack_fffffffffffffe88,
                 (allocator_type *)in_stack_fffffffffffffe80);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x88a28e);
      IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                (this_00,in_stack_fffffffffffffe88,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe80 =
           (allocator_type *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_b0->super_SDT);
      in_stack_fffffffffffffe88 = local_e9;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x88a2d1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 (size_type)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x88a2f7);
      IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 in_stack_fffffffffffffe88,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe80)
      ;
      in_stack_fffffffffffffe7c =
           IndexTools::IndividualToJointIndices
                     (&in_stack_fffffffffffffe88->super_SDT,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe78 = Globals::CastLIndexToIndex((ulong)in_stack_fffffffffffffe7c);
      local_90 = in_stack_fffffffffffffe78;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe80)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe80);
    }
    this_01 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(in_RDI + 0x178),(ulong)local_a4);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_01,(ulong)local_90);
    in_stack_fffffffffffffe74 = *pvVar7;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_88,(ulong)local_a4);
    *pvVar8 = in_stack_fffffffffffffe74;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe74);
  }
  IVar3 = IndexTools::IndividualToJointIndices
                    (&in_stack_fffffffffffffe88->super_SDT,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffe80);
  uVar9 = (ulong)IVar3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe80);
  return uVar9;
}

Assistant:

LIndex 
BGCG_SolverNonserialDynamicProgramming::GetJpolIndexForBestResponses(const vector<Index> &agentOrdering) const
{
    size_t nrAgents = GetBGCG()->GetNrAgents();

    //Get the nr of policies for all agents
    vector<size_t> nrPols;
    for(Index agI=0; agI < nrAgents; agI++)
        nrPols.push_back(CastLIndexToIndex(GetBGCG()->GetNrPolicies(agI)));

//we store the index, not the policy itelf
//JointPolicyPureVector(*cgbg, TYPE_INDEX ) bestJointBGPolicy;
    vector<Index > selectedBRIs(nrAgents);

    Index neighJointPol = 0;
    vector<Index>::const_reverse_iterator rit = agentOrdering.rbegin();
    while(rit != agentOrdering.rend())
    {
        Index agI=*rit;
        const Scope& brSc = _m_bestResponseScopes[agI];
#if DEBUG_BGCG_SolverNonserialDynamicProgramming
        cout << "selecting best response policy for agent "<< agI <<
            ". bestResponseScope(its neighbors) is " <<
            SoftPrint(brSc) << endl;
#endif        
        if(brSc.size() > 0)
        {
            //get the policies selected by the agents in brSc and convert
            //it to neighJointPol index
            vector<Index> restrictedBRIs(brSc.size());
            IndexTools::RestrictIndividualIndicesToScope(selectedBRIs, brSc,
                                                         restrictedBRIs);
            vector<size_t> nrNeighborsPolicies(brSc.size());
            IndexTools::RestrictIndividualIndicesToScope(nrPols, brSc,
                nrNeighborsPolicies);
/*            for(Scope::const_iterator brSc_it = brSc.begin(); 
                    brSc_it != brSc.end(); brSc_it++)
            {
                size_t nrpols = cgbg->GetNrPolicies(*brSc_it);
                nrNeighborsPolicies.push_back(nrpols);
//                nrJointNeighborPolicies *= nrpols;
            }
*/            
            Index brSc_jointIndex = CastLIndexToIndex(IndexTools::IndividualToJointIndices
                                                      (restrictedBRIs, nrNeighborsPolicies));
            neighJointPol = brSc_jointIndex;
        }
        else
            neighJointPol = 0;

        selectedBRIs[agI] = _m_bestResponses[agI][neighJointPol];

#if 0 && DEBUG_BGCG_SolverNonserialDynamicProgramming
        PolicyPureVector brPol(*GetBGCG(), agI, TYPE_INDEX);
        brPol.SetIndex(selectedBRIs[agI]);
        cout << "selecting best response for joint neighbor index "<< 
            neighJointPol <<endl;
        cout << "selected policy index selectedBRIs[agI]="<< selectedBRIs[agI]
             <<", corresponding to BG policy:"<<endl
             <<brPol.SoftPrint();
#endif        
        rit++;
    }
    
    //Get the joint policy index
    LIndex bestJointBGPolicyIndex = IndexTools::IndividualToJointIndices(
            selectedBRIs, nrPols);

    return(bestJointBGPolicyIndex);
}